

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
          (StringTree *__return_storage_ptr__,StringTree *this,CappedArray<char,_14UL> *params,
          ArrayPtr<const_char> *params_1,CappedArray<char,_14UL> *params_2,
          ArrayPtr<const_char> *params_3,CappedArray<char,_26UL> *params_4,
          ArrayPtr<const_char> *params_5,CappedArray<char,_26UL> *params_6)

{
  CappedArray<char,_26UL> *rest_3;
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_a8;
  StringTree *local_90;
  CappedArray<char,_14UL> *local_88;
  CappedArray<char,_14UL> *local_80;
  CappedArray<char,_14UL> *local_78;
  CappedArray<char,_26UL> *local_70;
  size_t local_68;
  undefined8 uStack_60;
  char *local_58;
  undefined8 uStack_50;
  char *local_48;
  undefined8 uStack_40;
  char *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_68 = this->size_;
  uStack_60 = *(undefined8 *)params->content;
  local_58 = params_1->ptr;
  uStack_50 = *(undefined8 *)params_2->content;
  local_48 = params_3->ptr;
  uStack_40 = *(undefined8 *)params_4->content;
  local_38 = params_5->ptr;
  nums._M_len = (size_type)params_4;
  nums._M_array = (iterator)0x7;
  local_70 = (CappedArray<char,_26UL> *)params_3;
  sVar1 = kj::_::sum((_ *)&local_68,nums);
  rest_3 = local_70;
  __return_storage_ptr__->size_ = sVar1;
  local_68 = this->size_;
  uStack_60 = *(undefined8 *)params->content;
  local_58 = params_1->ptr;
  uStack_50 = *(undefined8 *)params_2->content;
  local_48 = (char *)local_70->currentSize;
  uStack_40 = *(undefined8 *)params_4->content;
  local_38 = params_5->ptr;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x7;
  local_90 = this;
  local_88 = params;
  local_80 = (CappedArray<char,_14UL> *)params_1;
  local_78 = params_2;
  sVar1 = kj::_::sum((_ *)&local_68,nums_00);
  heapString((String *)&local_a8,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_a8);
  Array<char>::~Array((Array<char> *)&local_a8);
  local_48 = (char *)0x0;
  uStack_40 = 0;
  local_58 = (char *)0x0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_38 = (char *)0x0;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x7;
  sVar1 = kj::_::sum((_ *)&local_68,nums_01);
  local_a8.ptr = kj::_::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_a8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_a8.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_a8);
  Array<kj::StringTree::Branch>::~Array(&local_a8);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,pos,0,(CappedArray<char,_14UL> *)local_90,
             (ArrayPtr<const_char> *)local_88,local_80,(ArrayPtr<const_char> *)local_78,rest_3,
             (ArrayPtr<const_char> *)params_4,(CappedArray<char,_26UL> *)params_5);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}